

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

void * yang_read_ext(lys_module *module,void *actual,char *ext_name,char *ext_arg,
                    yytokentype actual_type,yytokentype backup_type,int is_ext_instance)

{
  long lVar1;
  LY_STMT LVar2;
  bool bVar3;
  lys_ext_instance *plVar4;
  LY_ERR *pLVar5;
  char *pcVar6;
  long *plVar7;
  LY_STMT stmt;
  byte bVar8;
  uint8_t uVar9;
  byte bVar10;
  lyext_substmt *local_50;
  lyext_substmt *info;
  lys_ext *local_40;
  LY_STMT local_38;
  undefined4 local_34;
  
  info = (lyext_substmt *)actual;
  local_40 = (lys_ext *)ext_name;
  if (backup_type == NODE) {
    plVar4 = yang_ext_instance(actual,actual_type,is_ext_instance);
    if (plVar4 == (lys_ext_instance *)0x0) {
      return (void *)0x0;
    }
    if (actual_type != BELONGS_TO_KEYWORD) {
      if (actual_type == ARGUMENT_KEYWORD) {
        plVar4->insubstmt = '\x01';
        local_38 = LY_STMT_ARGUMENT;
        bVar3 = true;
        local_34 = 0;
        bVar10 = 1;
      }
      else {
        plVar4->insubstmt = '\0';
        bVar3 = false;
        local_34 = 0;
        bVar10 = 0;
        local_38 = LY_STMT_UNKNOWN;
      }
      goto LAB_0014e379;
    }
    plVar4->insubstmt = '\x03';
    local_38 = LY_STMT_BELONGSTO;
    local_34 = (undefined4)CONCAT71((int7)((ulong)plVar4 >> 8),1);
    goto LAB_0014e375;
  }
  plVar4 = yang_ext_instance(actual,backup_type,is_ext_instance);
  if (plVar4 == (lys_ext_instance *)0x0) {
    return (void *)0x0;
  }
  switch(actual_type) {
  case BASE_KEYWORD:
    plVar4->insubstmt = '\x02';
    if (backup_type == TYPE_KEYWORD) {
      local_38 = LY_STMT_BASE;
      uVar9 = *(uint8_t *)(*(long *)&info->cardinality + 0x30);
    }
    else {
      local_38 = LY_STMT_BASE;
      if (backup_type != IDENTITY_KEYWORD) break;
LAB_0014e490:
      uVar9 = info[1].field_0x7;
    }
    goto LAB_0014e497;
  case BELONGS_TO_KEYWORD:
  case BIT_KEYWORD:
  case CASE_KEYWORD:
  case CHOICE_KEYWORD:
  case CONTAINER_KEYWORD:
  case ENUM_KEYWORD:
  case EXTENSION_KEYWORD:
  case DEVIATION_KEYWORD:
  case DEVIATE_KEYWORD:
  case FEATURE_KEYWORD:
  case GROUPING_KEYWORD:
  case IDENTITY_KEYWORD:
  case IF_FEATURE_KEYWORD:
  case IMPORT_KEYWORD:
  case INCLUDE_KEYWORD:
  case INPUT_KEYWORD:
  case LEAF_KEYWORD:
  case LEAF_LIST_KEYWORD:
  case LENGTH_KEYWORD:
  case LIST_KEYWORD:
  case MODULE_KEYWORD:
  case MUST_KEYWORD:
  case NOTIFICATION_KEYWORD:
  case OUTPUT_KEYWORD:
  case PATTERN_KEYWORD:
  case RANGE_KEYWORD:
  case REFINE_KEYWORD:
  case REVISION_KEYWORD:
  case RPC_KEYWORD:
  case SUBMODULE_KEYWORD:
  case TYPE_KEYWORD:
  case TYPEDEF_KEYWORD:
  case USES_KEYWORD:
  case WHEN_KEYWORD:
switchD_0014e069_caseD_116:
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
           ,0x986);
    return (void *)0x0;
  case CONFIG_KEYWORD:
    plVar4->insubstmt = '\x17';
    local_38 = LY_STMT_CONFIG;
    break;
  case CONTACT_KEYWORD:
    plVar4->insubstmt = '\x04';
    local_38 = LY_STMT_CONTACT;
    break;
  case DEFAULT_KEYWORD:
    plVar4->insubstmt = '\x05';
    if (backup_type == ADD_KEYWORD) {
      local_38 = LY_STMT_DEFAULT;
      uVar9 = info->field_0x5;
    }
    else {
      if (backup_type == REFINE_KEYWORD) {
        local_38 = LY_STMT_DEFAULT;
        goto LAB_0014e490;
      }
      local_38 = LY_STMT_DEFAULT;
      if (backup_type != LEAF_LIST_KEYWORD) break;
      uVar9 = info[1].field_0x6;
    }
LAB_0014e497:
    plVar4->insubstmt_index = uVar9;
    break;
  case DESCRIPTION_KEYWORD:
    plVar4->insubstmt = '\x06';
    local_38 = LY_STMT_DESCRIPTION;
    break;
  case ERROR_APP_TAG_KEYWORD:
    plVar4->insubstmt = '\a';
    local_38 = LY_STMT_ERRTAG;
    break;
  case ERROR_MESSAGE_KEYWORD:
    plVar4->insubstmt = '\b';
    local_38 = LY_STMT_ERRMSG;
    break;
  case FRACTION_DIGITS_KEYWORD:
    plVar4->insubstmt = '\x1b';
    local_38 = LY_STMT_DIGITS;
    break;
  case KEY_KEYWORD:
    plVar4->insubstmt = '\t';
    local_38 = LY_STMT_KEY;
    break;
  case MANDATORY_KEYWORD:
    plVar4->insubstmt = '\x18';
    local_38 = LY_STMT_MANDATORY;
    break;
  case MAX_ELEMENTS_KEYWORD:
    plVar4->insubstmt = '\x1c';
    local_38 = LY_STMT_MAX;
    break;
  case MIN_ELEMENTS_KEYWORD:
    plVar4->insubstmt = '\x1d';
    local_38 = LY_STMT_MIN;
    break;
  case NAMESPACE_KEYWORD:
    plVar4->insubstmt = '\n';
    local_38 = LY_STMT_NAMESPACE;
    break;
  case ORDERED_BY_KEYWORD:
    plVar4->insubstmt = '\x19';
    local_38 = LY_STMT_ORDEREDBY;
    break;
  case ORGANIZATION_KEYWORD:
    plVar4->insubstmt = '\v';
    local_38 = LY_STMT_ORGANIZATION;
    break;
  case PATH_KEYWORD:
    plVar4->insubstmt = '\f';
    local_38 = LY_STMT_PATH;
    break;
  case POSITION_KEYWORD:
    plVar4->insubstmt = '\x1e';
    local_38 = LY_STMT_POSITION;
    break;
  case PREFIX_KEYWORD:
    plVar4->insubstmt = '\r';
    local_38 = LY_STMT_PREFIX;
    break;
  case PRESENCE_KEYWORD:
    plVar4->insubstmt = '\x0e';
    local_38 = LY_STMT_PRESENCE;
    break;
  case REFERENCE_KEYWORD:
    plVar4->insubstmt = '\x0f';
    local_38 = LY_STMT_REFERENCE;
    break;
  case REQUIRE_INSTANCE_KEYWORD:
    plVar4->insubstmt = '\x15';
    local_38 = LY_STMT_REQINSTANCE;
    break;
  case REVISION_DATE_KEYWORD:
    plVar4->insubstmt = '\x10';
    local_38 = LY_STMT_REVISIONDATE;
    break;
  case STATUS_KEYWORD:
    plVar4->insubstmt = '\x1a';
    local_38 = LY_STMT_STATUS;
    break;
  case UNIQUE_KEYWORD:
    plVar4->insubstmt = '\x1f';
    if ((int)backup_type < 0x155) {
      if (backup_type == LIST_KEYWORD) {
        local_38 = LY_STMT_UNIQUE;
        goto LAB_0014e490;
      }
      local_38 = LY_STMT_UNIQUE;
      if (backup_type == ADD_KEYWORD) goto LAB_0014e44a;
    }
    else {
      local_38 = LY_STMT_UNIQUE;
      if ((backup_type == DELETE_KEYWORD) || (backup_type == REPLACE_KEYWORD)) {
LAB_0014e44a:
        local_38 = LY_STMT_UNIQUE;
        uVar9 = *(uint8_t *)((long)&info->offset + 2);
        goto LAB_0014e497;
      }
    }
    break;
  case UNITS_KEYWORD:
    plVar4->insubstmt = '\x11';
    local_38 = LY_STMT_UNITS;
    break;
  case VALUE_KEYWORD:
    plVar4->insubstmt = '\x12';
    local_38 = LY_STMT_VALUE;
    break;
  case YANG_VERSION_KEYWORD:
    plVar4->insubstmt = '\x13';
    local_38 = LY_STMT_VERSION;
    break;
  case YIN_ELEMENT_KEYWORD:
    plVar4->insubstmt = '\x16';
    local_38 = LY_STMT_YINELEM;
    break;
  default:
    if (actual_type != MODIFIER_KEYWORD) goto switchD_0014e069_caseD_116;
    plVar4->insubstmt = '\x14';
    local_38 = LY_STMT_MODIFIER;
  }
  local_34 = 0;
LAB_0014e375:
  bVar10 = 0;
  bVar3 = true;
LAB_0014e379:
  *(byte *)&plVar4->flags = (byte)plVar4->flags | 2;
  plVar4->def = local_40;
  pcVar6 = lydict_insert_zc(module->ctx,ext_arg);
  plVar4->arg_value = pcVar6;
  if ((bVar3 && is_ext_instance != 0) && (plVar4->parent_type == '\v')) {
    bVar8 = backup_type == BELONGS_TO_KEYWORD | (byte)local_34;
    LVar2 = local_38;
    if (backup_type == ARGUMENT_KEYWORD) {
      LVar2 = LY_STMT_ARGUMENT;
    }
    stmt = LY_STMT_BELONGSTO;
    if (bVar8 == 0) {
      stmt = LVar2;
    }
    plVar7 = (long *)lys_ext_complex_get_substmt(stmt,(lys_ext_instance_complex *)info,&local_50);
    if (((plVar7 == (long *)0x0) || (local_50->cardinality < LY_STMT_CARD_SOME)) ||
       (plVar7 = (long *)*plVar7, plVar7 == (long *)0x0)) {
      uVar9 = '\0';
    }
    else {
      uVar9 = 0xff - (bVar8 | backup_type == ARGUMENT_KEYWORD | bVar10);
      do {
        uVar9 = uVar9 + '\x01';
        lVar1 = *plVar7;
        plVar7 = plVar7 + 1;
      } while (lVar1 != 0);
    }
    plVar4->insubstmt_index = uVar9;
  }
  return plVar4;
}

Assistant:

void *
yang_read_ext(struct lys_module *module, void *actual, char *ext_name, char *ext_arg,
              enum yytokentype actual_type, enum yytokentype backup_type, int is_ext_instance)
{
    struct lys_ext_instance *instance;
    LY_STMT stmt = LY_STMT_UNKNOWN;

    if (backup_type != NODE) {
        instance = yang_ext_instance(actual, backup_type, is_ext_instance);
        if (!instance) {
            return NULL;
        }
        switch (actual_type) {
        case YANG_VERSION_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_VERSION;
            stmt = LY_STMT_VERSION;
            break;
        case NAMESPACE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_NAMESPACE;
            stmt = LY_STMT_NAMESPACE;
            break;
        case PREFIX_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_PREFIX;
            stmt = LY_STMT_PREFIX;
            break;
        case REVISION_DATE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_REVISIONDATE;
            stmt = LY_STMT_REVISIONDATE;
            break;
        case DESCRIPTION_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_DESCRIPTION;
            stmt = LY_STMT_DESCRIPTION;
            break;
        case REFERENCE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_REFERENCE;
            stmt = LY_STMT_REFERENCE;
            break;
        case CONTACT_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_CONTACT;
            stmt = LY_STMT_CONTACT;
            break;
        case ORGANIZATION_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ORGANIZATION;
            stmt = LY_STMT_ORGANIZATION;
            break;
        case YIN_ELEMENT_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_YINELEM;
            stmt = LY_STMT_YINELEM;
            break;
        case STATUS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_STATUS;
            stmt = LY_STMT_STATUS;
            break;
        case BASE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_BASE;
            stmt = LY_STMT_BASE;
            if (backup_type == IDENTITY_KEYWORD) {
                instance->insubstmt_index = ((struct lys_ident *)actual)->base_size;
            } else if (backup_type == TYPE_KEYWORD) {
                instance->insubstmt_index = ((struct yang_type *)actual)->type->info.ident.count;
            }
            break;
        case DEFAULT_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_DEFAULT;
            stmt = LY_STMT_DEFAULT;
            switch (backup_type) {
            case LEAF_LIST_KEYWORD:
                instance->insubstmt_index = ((struct lys_node_leaflist *)actual)->dflt_size;
                break;
            case REFINE_KEYWORD:
                instance->insubstmt_index = ((struct lys_refine *)actual)->dflt_size;
                break;
            case ADD_KEYWORD:
                instance->insubstmt_index = ((struct lys_deviate *)actual)->dflt_size;
                break;
            default:
                /* nothing changes */
                break;
            }
            break;
        case UNITS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_UNITS;
            stmt = LY_STMT_UNITS;
            break;
        case REQUIRE_INSTANCE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_REQINSTANCE;
            stmt = LY_STMT_REQINSTANCE;
            break;
        case PATH_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_PATH;
            stmt = LY_STMT_PATH;
            break;
        case ERROR_MESSAGE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ERRMSG;
            stmt = LY_STMT_ERRMSG;
            break;
        case ERROR_APP_TAG_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ERRTAG;
            stmt = LY_STMT_ERRTAG;
            break;
        case MODIFIER_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_MODIFIER;
            stmt = LY_STMT_MODIFIER;
            break;
        case FRACTION_DIGITS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_DIGITS;
            stmt = LY_STMT_DIGITS;
            break;
        case VALUE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_VALUE;
            stmt = LY_STMT_VALUE;
            break;
        case POSITION_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_POSITION;
            stmt = LY_STMT_POSITION;
            break;
        case PRESENCE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_PRESENCE;
            stmt = LY_STMT_PRESENCE;
            break;
        case CONFIG_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_CONFIG;
            stmt = LY_STMT_CONFIG;
            break;
        case MANDATORY_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_MANDATORY;
            stmt = LY_STMT_MANDATORY;
            break;
        case MIN_ELEMENTS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_MIN;
            stmt = LY_STMT_MIN;
            break;
        case MAX_ELEMENTS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_MAX;
            stmt = LY_STMT_MAX;
            break;
        case ORDERED_BY_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ORDEREDBY;
            stmt = LY_STMT_ORDEREDBY;
            break;
        case KEY_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_KEY;
            stmt = LY_STMT_KEY;
            break;
        case UNIQUE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_UNIQUE;
            stmt = LY_STMT_UNIQUE;
            switch (backup_type) {
            case LIST_KEYWORD:
                instance->insubstmt_index = ((struct lys_node_list *)actual)->unique_size;
                break;
            case ADD_KEYWORD:
            case DELETE_KEYWORD:
            case REPLACE_KEYWORD:
                instance->insubstmt_index = ((struct lys_deviate *)actual)->unique_size;
                break;
            default:
                /* nothing changes */
                break;
            }
            break;
        default:
            LOGINT;
            return NULL;
        }
    } else {
        instance = yang_ext_instance(actual, actual_type, is_ext_instance);
        if (!instance) {
            return NULL;
        }
        instance->insubstmt = LYEXT_SUBSTMT_SELF;
        switch (actual_type) {
        case ARGUMENT_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ARGUMENT;
            stmt = LY_STMT_ARGUMENT;
            break;
        case BELONGS_TO_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_BELONGSTO;
            stmt = LY_STMT_BELONGSTO;
            break;
        default:
            instance->insubstmt = LYEXT_SUBSTMT_SELF;
            break;
        }
    }
    instance->flags |= LYEXT_OPT_YANG;
    instance->def = (struct lys_ext *)ext_name;    /* hack for UNRES */
    instance->arg_value = lydict_insert_zc(module->ctx, ext_arg);
    if (is_ext_instance && stmt != LY_STMT_UNKNOWN && instance->parent_type == LYEXT_PAR_EXTINST) {
        instance->insubstmt_index = yang_fill_ext_substm_index(actual, stmt, backup_type);
    }
    return instance;
}